

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
insert(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
      *siblings)

{
  size_t sVar1;
  unit_t *puVar2;
  int *piVar3;
  ulong uVar4;
  pointer pnVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pnVar10;
  pointer pnVar11;
  size_t sVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  long local_50;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  new_siblings;
  
  if (this->error_ < 0) {
    return 0;
  }
  uVar9 = (ulong)((siblings->
                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  )._M_impl.super__Vector_impl_data._M_start)->code + 1;
  if (uVar9 <= this->next_check_pos_) {
    uVar9 = this->next_check_pos_;
  }
  if (this->alloc_size_ <= uVar9 - 1) {
    resize(this,uVar9);
  }
  local_50 = 0;
  bVar13 = false;
  uVar9 = uVar9 - 1;
  do {
    do {
      while( true ) {
        uVar8 = uVar9;
        uVar9 = uVar8 + 1;
        if (this->alloc_size_ <= uVar9) {
          resize(this,uVar8 + 2);
        }
        if (this->array_[uVar8 + 1].check == 0) break;
        local_50 = local_50 + 1;
      }
      if (!bVar13) {
        this->next_check_pos_ = uVar9;
      }
      sVar12 = uVar9 - ((siblings->
                        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                        )._M_impl.super__Vector_impl_data._M_start)->code;
      uVar4 = this->alloc_size_;
      if (uVar4 <= (siblings->
                   super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].code + sVar12) {
        auVar15._8_4_ = (int)(uVar4 >> 0x20);
        auVar15._0_8_ = uVar4;
        auVar15._12_4_ = 0x45300000;
        sVar6 = this->key_size_;
        auVar16._8_4_ = (int)(sVar6 >> 0x20);
        auVar16._0_8_ = sVar6;
        auVar16._12_4_ = 0x45300000;
        sVar1 = this->progress_;
        auVar17._8_4_ = (int)(sVar1 >> 0x20);
        auVar17._0_8_ = sVar1;
        auVar17._12_4_ = 0x45300000;
        dVar20 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) /
                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
        dVar14 = 1.05;
        if (1.05 <= dVar20) {
          dVar14 = dVar20;
        }
        dVar14 = dVar14 * ((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
        uVar4 = (ulong)dVar14;
        resize(this,(long)(dVar14 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
      }
      bVar13 = true;
    } while (this->used_[sVar12] != '\0');
    pnVar10 = (siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(siblings->
                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar10;
    uVar4 = 0;
    do {
      pnVar10 = pnVar10 + 1;
      uVar4 = uVar4 + 1;
      if ((ulong)(lVar7 >> 5) <= uVar4) {
        auVar18._8_4_ = (int)((ulong)local_50 >> 0x20);
        auVar18._0_8_ = local_50;
        auVar18._12_4_ = 0x45300000;
        lVar7 = (uVar8 - this->next_check_pos_) + 2;
        auVar19._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar19._0_8_ = lVar7;
        auVar19._12_4_ = 0x45300000;
        if (0.95 <= ((auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) /
                    ((auVar19._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) {
          this->next_check_pos_ = uVar9;
        }
        this->used_[sVar12] = '\x01';
        pnVar10 = (siblings->
                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pnVar5 = (siblings->
                 super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = (long)pnVar5 - (long)pnVar10 >> 5;
        uVar9 = (pnVar5[-1].code + 1) + sVar12;
        if (uVar9 < this->size_) {
          uVar9 = this->size_;
        }
        this->size_ = uVar9;
        puVar2 = this->array_;
        pnVar11 = pnVar10;
        while (bVar13 = lVar7 != 0, lVar7 = lVar7 + -1, bVar13) {
          puVar2[sVar12 + pnVar11->code].check = (uint)sVar12;
          pnVar11 = pnVar11 + 1;
        }
        lVar7 = 0;
        uVar9 = 0;
        do {
          if ((ulong)((long)pnVar5 - (long)pnVar10 >> 5) <= uVar9) {
            return sVar12;
          }
          new_siblings.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          new_siblings.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          new_siblings.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sVar6 = fetch(this,(node_t *)((long)&pnVar10->code + lVar7),
                        (vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                         *)&new_siblings.
                            super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                       );
          if (sVar6 == 0) {
            piVar3 = this->value_;
            pnVar10 = (siblings->
                      super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar8 = *(ulong *)((long)&pnVar10->left + lVar7);
            if (piVar3 != (int *)0x0) {
              uVar8 = (ulong)(uint)piVar3[uVar8];
            }
            this->array_[sVar12 + *(uint *)((long)&pnVar10->code + lVar7)].base = ~(uint)uVar8;
            if ((piVar3 != (int *)0x0) && (piVar3[*(long *)((long)&pnVar10->left + lVar7)] < 0)) {
              this->error_ = -2;
              std::
              _Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              ::~_Vector_base(&new_siblings.
                               super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                             );
              return 0;
            }
            sVar6 = this->progress_ + 1;
            this->progress_ = sVar6;
            if (this->progress_func_ != (_func_int_size_t_size_t *)0x0) {
              (*this->progress_func_)(sVar6,this->key_size_);
            }
          }
          else {
            sVar6 = insert(this,(vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                 *)&new_siblings.
                                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                          );
            this->array_
            [sVar12 + *(uint *)((long)&((siblings->
                                        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->code + lVar7)].
            base = (int)sVar6;
          }
          std::
          _Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ::~_Vector_base(&new_siblings.
                           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                         );
          uVar9 = uVar9 + 1;
          pnVar10 = (siblings->
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pnVar5 = (siblings->
                   super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          lVar7 = lVar7 + 0x20;
        } while( true );
      }
    } while (this->array_[sVar12 + pnVar10->code].check == 0);
    bVar13 = true;
  } while( true );
}

Assistant:

size_t insert(const std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    size_t begin = 0;
    size_t pos   = _max((size_t)siblings[0].code + 1, next_check_pos_) - 1;
    size_t nonzero_num = 0;
    int    first = 0;

    if (alloc_size_ <= pos) resize(pos + 1);

    while (true) {
   next:
      ++pos;

      if (alloc_size_ <= pos) resize(pos + 1);

      if (array_[pos].check) {
        ++nonzero_num;
        continue;
      } else if (!first) {
        next_check_pos_ = pos;
        first = 1;
      }

      begin = pos - siblings[0].code;
      if (alloc_size_ <= (begin + siblings[siblings.size()-1].code))
        resize(static_cast<size_t>(alloc_size_ *
                                   _max(1.05, 1.0 * key_size_ / progress_)));

      if (used_[begin]) continue;

      for (size_t i = 1; i < siblings.size(); ++i)
        if (array_[begin + siblings[i].code].check != 0) goto next;

      break;
    }

    // -- Simple heuristics --
    // if the percentage of non-empty contents in check between the index
    // 'next_check_pos' and 'check' is greater than some constant
    // value(e.g. 0.9),
    // new 'next_check_pos' index is written by 'check'.
    if (1.0 * nonzero_num/(pos - next_check_pos_ + 1) >= 0.95)
      next_check_pos_ = pos;

    used_[begin] = 1;
    size_ = _max(size_,
                 begin +
                 static_cast<size_t>(siblings[siblings.size() - 1].code + 1));

    for (size_t i = 0; i < siblings.size(); ++i)
      array_[begin + siblings[i].code].check = begin;

    for (size_t i = 0; i < siblings.size(); ++i) {
      std::vector <node_t> new_siblings;

      if (!fetch(siblings[i], new_siblings)) {
        array_[begin + siblings[i].code].base =
            value_ ?
            static_cast<array_type_>(-value_[siblings[i].left]-1) :
            static_cast<array_type_>(-siblings[i].left-1);

        if (value_ && (array_type_)(-value_[siblings[i].left]-1) >= 0) {
          error_ = -2;
          return 0;
        }

        ++progress_;
        if (progress_func_)(*progress_func_)(progress_, key_size_);

      } else {
        size_t h = insert(new_siblings);
        array_[begin + siblings[i].code].base = h;
      }
    }

    return begin;
  }